

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::write
          (SamplingStrategyResponse *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint uVar2;
  ssize_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  TProtocol *prot;
  TOutputRecursionTracker local_28;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *oprot_local;
  SamplingStrategyResponse *this_local;
  
  prot = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  tracker.prot_._4_4_ = 0;
  apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker(&local_28,prot);
  uVar1 = apache::thrift::protocol::TProtocol::writeStructBegin(prot,"SamplingStrategyResponse");
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"strategyType",T_I32,1);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeI32(prot,this->strategyType);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
  tracker.prot_._4_4_ = uVar1 + tracker.prot_._4_4_;
  if (((byte)this->__isset & 1) != 0) {
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin
                      (prot,"probabilisticSampling",T_STRUCT,2);
    tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
    sVar3 = ProbabilisticSamplingStrategy::write
                      (&this->probabilisticSampling,__fd,__buf_00,(ulong)uVar1);
    tracker.prot_._4_4_ = tracker.prot_._4_4_ + (int)sVar3;
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
    tracker.prot_._4_4_ = uVar1 + tracker.prot_._4_4_;
  }
  if (((byte)this->__isset >> 1 & 1) != 0) {
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin
                      (prot,"rateLimitingSampling",T_STRUCT,3);
    tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
    sVar3 = RateLimitingSamplingStrategy::write
                      (&this->rateLimitingSampling,__fd,__buf_01,(ulong)uVar1);
    tracker.prot_._4_4_ = tracker.prot_._4_4_ + (int)sVar3;
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
    tracker.prot_._4_4_ = uVar1 + tracker.prot_._4_4_;
  }
  if (((byte)this->__isset >> 2 & 1) != 0) {
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin
                      (prot,"operationSampling",T_STRUCT,4);
    tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
    sVar3 = PerOperationSamplingStrategies::write
                      (&this->operationSampling,__fd,__buf_02,(ulong)uVar1);
    tracker.prot_._4_4_ = tracker.prot_._4_4_ + (int)sVar3;
    uVar1 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
    tracker.prot_._4_4_ = uVar1 + tracker.prot_._4_4_;
  }
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldStop(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeStructEnd(prot);
  uVar2 = uVar1 + tracker.prot_._4_4_;
  tracker.prot_._4_4_ = uVar2;
  apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker(&local_28);
  return (ulong)uVar2;
}

Assistant:

uint32_t SamplingStrategyResponse::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("SamplingStrategyResponse");

  xfer += oprot->writeFieldBegin("strategyType", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32((int32_t)this->strategyType);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.probabilisticSampling) {
    xfer += oprot->writeFieldBegin("probabilisticSampling", ::apache::thrift::protocol::T_STRUCT, 2);
    xfer += this->probabilisticSampling.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.rateLimitingSampling) {
    xfer += oprot->writeFieldBegin("rateLimitingSampling", ::apache::thrift::protocol::T_STRUCT, 3);
    xfer += this->rateLimitingSampling.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.operationSampling) {
    xfer += oprot->writeFieldBegin("operationSampling", ::apache::thrift::protocol::T_STRUCT, 4);
    xfer += this->operationSampling.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}